

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O3

void upb::generator::AddMessages
               (MessageDefPtr message,
               vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *messages)

{
  pointer *ppMVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  MessageDefPtr message_00;
  MessageDefPtr local_20;
  
  __position._M_current =
       (messages->super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_20.ptr_ = message.ptr_;
  if (__position._M_current ==
      (messages->super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>>::
    _M_realloc_insert<upb::MessageDefPtr_const&>
              ((vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>> *)messages,__position,
               &local_20);
  }
  else {
    (__position._M_current)->ptr_ = message.ptr_;
    ppMVar1 = &(messages->
               super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2 = upb_MessageDef_NestedMessageCount(local_20.ptr_);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      message_00.ptr_ = upb_MessageDef_NestedMessage(local_20.ptr_,iVar2);
      AddMessages(message_00,messages);
      iVar2 = iVar2 + 1;
      iVar3 = upb_MessageDef_NestedMessageCount(local_20.ptr_);
    } while (iVar2 < iVar3);
  }
  return;
}

Assistant:

void AddMessages(upb::MessageDefPtr message,
                 std::vector<upb::MessageDefPtr>* messages) {
  messages->push_back(message);
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddMessages(message.nested_message(i), messages);
  }
}